

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_transform_t *
golf_entity_get_world_transform
          (golf_transform_t *__return_storage_ptr__,golf_level_t *level,golf_entity_t *entity)

{
  float fVar1;
  undefined8 uVar2;
  golf_entity_t *pgVar3;
  long lVar4;
  mat4 m;
  long lVar5;
  float fVar6;
  vec3 vVar10;
  vec3 v1;
  quat qVar11;
  quat q;
  quat v;
  vec3 v2;
  float local_e4;
  float local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  float local_78;
  float fStack_74;
  mat4 local_60;
  float fVar7;
  float fVar8;
  float fVar9;
  
  vVar10 = vec3_create(0.0,0.0,0.0);
  local_e0 = vVar10.z;
  local_c8 = vVar10._0_8_;
  vVar10 = vec3_create(1.0,1.0,1.0);
  local_e4 = vVar10.z;
  local_d8 = vVar10._0_8_;
  qVar11 = quat_create(0.0,0.0,0.0,1.0);
  fVar8 = qVar11.z;
  fVar9 = qVar11.w;
  fVar6 = qVar11.x;
  fVar7 = qVar11.y;
  lVar5 = (long)entity->parent_idx;
  if (-1 < lVar5) {
    pgVar3 = (level->entities).data;
    if ((ulong)pgVar3[lVar5].type < 8) {
      lVar4 = *(long *)(&DAT_0023d700 + (ulong)pgVar3[lVar5].type * 8);
      local_c8 = *(undefined8 *)(pgVar3[lVar5].name + lVar4 + -0xc);
      local_e0 = *(float *)(pgVar3[lVar5].name + lVar4 + -4);
      fVar6 = (float)*(undefined8 *)(pgVar3[lVar5].name + lVar4);
      fVar7 = (float)((ulong)*(undefined8 *)(pgVar3[lVar5].name + lVar4) >> 0x20);
      fVar8 = (float)*(undefined8 *)(pgVar3[lVar5].name + lVar4 + 8);
      fVar9 = (float)((ulong)*(undefined8 *)(pgVar3[lVar5].name + lVar4 + 8) >> 0x20);
      local_d8 = *(undefined8 *)(pgVar3[lVar5].name + lVar4 + 0x10);
      local_e4 = *(float *)(pgVar3[lVar5].name + lVar4 + 0x18);
    }
  }
  if ((ulong)entity->type < 8) {
    lVar5 = *(long *)(&DAT_0023d700 + (ulong)entity->type * 8);
    qVar11.y = fVar7;
    qVar11.x = fVar6;
    qVar11.w = fVar9;
    qVar11.z = fVar8;
    v._8_8_ = *(undefined8 *)(entity->name + lVar5 + 8);
    v._0_8_ = *(undefined8 *)(entity->name + lVar5);
    qVar11 = quat_multiply(qVar11,v);
    uVar2 = *(undefined8 *)(entity->name + lVar5 + 0x10);
    fVar1 = *(float *)(entity->name + lVar5 + 0x18);
    q.y = fVar7;
    q.x = fVar6;
    q.w = fVar9;
    q.z = fVar8;
    mat4_from_quat(&local_60,q);
    m.m[2] = local_60.m[2];
    m.m[3] = local_60.m[3];
    m.m[0] = local_60.m[0];
    m.m[1] = local_60.m[1];
    m.m[4] = local_60.m[4];
    m.m[5] = local_60.m[5];
    m.m[6] = local_60.m[6];
    m.m[7] = local_60.m[7];
    m.m[8] = local_60.m[8];
    m.m[9] = local_60.m[9];
    m.m[10] = local_60.m[10];
    m.m[0xb] = local_60.m[0xb];
    m.m[0xc] = local_60.m[0xc];
    m.m[0xd] = local_60.m[0xd];
    m.m[0xe] = local_60.m[0xe];
    m.m[0xf] = local_60.m[0xf];
    vVar10.z = *(float *)(entity->name + lVar5 + -4);
    vVar10._0_8_ = *(undefined8 *)(entity->name + lVar5 + -0xc);
    vVar10 = vec3_apply_mat4(vVar10,1.0,m);
    v1.x = vVar10.x * (float)local_d8;
    v1.y = vVar10.y * local_d8._4_4_;
    v1.z = vVar10.z * local_e4;
    v2.z = local_e0;
    v2.x = (float)(undefined4)local_c8;
    v2.y = (float)local_c8._4_4_;
    vVar10 = vec3_add(v1,v2);
    (__return_storage_ptr__->position).x = (float)(int)vVar10._0_8_;
    (__return_storage_ptr__->position).y = (float)(int)((ulong)vVar10._0_8_ >> 0x20);
    (__return_storage_ptr__->position).z = vVar10.z;
    (__return_storage_ptr__->scale).x = (float)uVar2 * (float)local_d8;
    (__return_storage_ptr__->scale).y = (float)((ulong)uVar2 >> 0x20) * local_d8._4_4_;
    (__return_storage_ptr__->scale).z = fVar1 * local_e4;
    local_78 = qVar11.x;
    fStack_74 = qVar11.y;
    (__return_storage_ptr__->rotation).x = local_78;
    (__return_storage_ptr__->rotation).y = fStack_74;
    (__return_storage_ptr__->rotation).z = qVar11.z;
    (__return_storage_ptr__->rotation).w = qVar11.w;
  }
  else {
    golf_log_warning("Attempting to get world transform on entity with no transform");
    (__return_storage_ptr__->position).x = (float)(undefined4)local_c8;
    (__return_storage_ptr__->position).y = (float)local_c8._4_4_;
    (__return_storage_ptr__->position).z = local_e0;
    (__return_storage_ptr__->rotation).x = fVar6;
    (__return_storage_ptr__->rotation).y = fVar7;
    (__return_storage_ptr__->rotation).z = fVar8;
    (__return_storage_ptr__->rotation).w = fVar9;
    (__return_storage_ptr__->scale).x = (float)local_d8;
    (__return_storage_ptr__->scale).y = local_d8._4_4_;
    (__return_storage_ptr__->scale).z = local_e4;
  }
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_entity_get_world_transform(golf_level_t *level, golf_entity_t *entity) {
    golf_transform_t parent_transform = golf_transform(V3(0, 0, 0), V3(1, 1, 1), QUAT(0, 0, 0, 1));
    if (entity->parent_idx >= 0) {
        golf_entity_t *parent_entity = &level->entities.data[entity->parent_idx];
        golf_transform_t *transform = golf_entity_get_transform(parent_entity);
        if (transform) {
            parent_transform = *transform;
        }
    }

    golf_transform_t *transform = golf_entity_get_transform(entity);
    if (!transform) {
        golf_log_warning("Attempting to get world transform on entity with no transform");
        return parent_transform;
    }

    quat rotation = quat_multiply(parent_transform.rotation, transform->rotation);

    vec3 scale = parent_transform.scale;
    scale.x *= transform->scale.x;
    scale.y *= transform->scale.y;
    scale.z *= transform->scale.z;

    vec3 position = vec3_apply_mat4(transform->position, 1, mat4_from_quat(parent_transform.rotation));
    position.x *= parent_transform.scale.x;
    position.y *= parent_transform.scale.y;
    position.z *= parent_transform.scale.z;
    position = vec3_add(position, parent_transform.position);

    return golf_transform(position, scale, rotation);
}